

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spend.cpp
# Opt level: O2

Result<wallet::SelectionResult> *
wallet::AttemptSelection
          (Result<wallet::SelectionResult> *__return_storage_ptr__,Chain *chain,
          CAmount *nTargetValue,OutputGroupTypeMap *groups,
          CoinSelectionParams *coin_selection_params,bool allow_mixed_output_types)

{
  bool bVar1;
  T *__x;
  _Base_ptr p_Var2;
  __normal_iterator<wallet::SelectionResult_*,_std::vector<wallet::SelectionResult,_std::allocator<wallet::SelectionResult>_>_>
  _Var3;
  long in_FS_OFFSET;
  vector<wallet::SelectionResult,_std::allocator<wallet::SelectionResult>_> results;
  vector<wallet::SelectionResult,_std::allocator<wallet::SelectionResult>_> local_108;
  bilingual_str local_e8;
  SelectionResult local_a8;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_108.super__Vector_base<wallet::SelectionResult,_std::allocator<wallet::SelectionResult>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_108.super__Vector_base<wallet::SelectionResult,_std::allocator<wallet::SelectionResult>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_108.super__Vector_base<wallet::SelectionResult,_std::allocator<wallet::SelectionResult>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  for (p_Var2 = (groups->groups_by_type)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(groups->groups_by_type)._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var2)) {
    ChooseSelectionResult
              (__return_storage_ptr__,chain,nTargetValue,(Groups *)&p_Var2[1]._M_parent,
               coin_selection_params);
    bVar1 = HasErrorMsg(__return_storage_ptr__);
    if (bVar1) goto LAB_002112ff;
    if (*(__index_type *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                 super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x70) ==
        '\x01') {
      __x = util::Result<wallet::SelectionResult>::value(__return_storage_ptr__);
      std::vector<wallet::SelectionResult,_std::allocator<wallet::SelectionResult>_>::push_back
                (&local_108,__x);
    }
    std::__detail::__variant::_Variant_storage<false,_bilingual_str,_wallet::SelectionResult>::
    ~_Variant_storage((_Variant_storage<false,_bilingual_str,_wallet::SelectionResult> *)
                      __return_storage_ptr__);
  }
  if (local_108.
      super__Vector_base<wallet::SelectionResult,_std::allocator<wallet::SelectionResult>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      local_108.
      super__Vector_base<wallet::SelectionResult,_std::allocator<wallet::SelectionResult>_>._M_impl.
      super__Vector_impl_data._M_start) {
    if ((allow_mixed_output_types) &&
       (1 < (groups->groups_by_type)._M_t._M_impl.super__Rb_tree_header._M_node_count)) {
      ChooseSelectionResult
                (__return_storage_ptr__,chain,nTargetValue,&groups->all_groups,coin_selection_params
                );
    }
    else {
      local_e8.original._M_dataplus._M_p = (pointer)&local_e8.original.field_2;
      local_e8.translated._M_string_length = 0;
      local_e8.translated.field_2._8_8_ = 0;
      local_e8.original.field_2._M_allocated_capacity = 0;
      local_e8.original.field_2._8_8_ = 0;
      local_e8.original._M_string_length = 0;
      local_e8.translated._M_dataplus._M_p = (pointer)&local_e8.translated.field_2;
      local_e8.translated.field_2._M_allocated_capacity = 0;
      std::__detail::__variant::_Variant_storage<false,bilingual_str,wallet::SelectionResult>::
      _Variant_storage<0ul,bilingual_str>
                ((_Variant_storage<false,bilingual_str,wallet::SelectionResult> *)
                 __return_storage_ptr__,&local_e8);
      bilingual_str::~bilingual_str(&local_e8);
    }
  }
  else {
    _Var3 = std::
            __min_element<__gnu_cxx::__normal_iterator<wallet::SelectionResult*,std::vector<wallet::SelectionResult,std::allocator<wallet::SelectionResult>>>,__gnu_cxx::__ops::_Iter_less_iter>
                      ();
    SelectionResult::SelectionResult(&local_a8,_Var3._M_current);
    std::__detail::__variant::_Variant_storage<false,bilingual_str,wallet::SelectionResult>::
    _Variant_storage<1ul,wallet::SelectionResult>
              ((_Variant_storage<false,bilingual_str,wallet::SelectionResult> *)
               __return_storage_ptr__,&local_a8);
    _GLOBAL__N_1::std::
    _Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
    ::~_Rb_tree((_Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
                 *)&local_a8);
  }
LAB_002112ff:
  std::vector<wallet::SelectionResult,_std::allocator<wallet::SelectionResult>_>::~vector
            (&local_108);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

util::Result<SelectionResult> AttemptSelection(interfaces::Chain& chain, const CAmount& nTargetValue, OutputGroupTypeMap& groups,
                               const CoinSelectionParams& coin_selection_params, bool allow_mixed_output_types)
{
    // Run coin selection on each OutputType and compute the Waste Metric
    std::vector<SelectionResult> results;
    for (auto& [type, group] : groups.groups_by_type) {
        auto result{ChooseSelectionResult(chain, nTargetValue, group, coin_selection_params)};
        // If any specific error message appears here, then something particularly wrong happened.
        if (HasErrorMsg(result)) return result; // So let's return the specific error.
        // Append the favorable result.
        if (result) results.push_back(*result);
    }
    // If we have at least one solution for funding the transaction without mixing, choose the minimum one according to waste metric
    // and return the result
    if (results.size() > 0) return *std::min_element(results.begin(), results.end());

    // If we can't fund the transaction from any individual OutputType, run coin selection one last time
    // over all available coins, which would allow mixing.
    // If TypesCount() <= 1, there is nothing to mix.
    if (allow_mixed_output_types && groups.TypesCount() > 1) {
        return ChooseSelectionResult(chain, nTargetValue, groups.all_groups, coin_selection_params);
    }
    // Either mixing is not allowed and we couldn't find a solution from any single OutputType, or mixing was allowed and we still couldn't
    // find a solution using all available coins
    return util::Error();
}